

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_rep.c
# Opt level: O3

int nsync_time_cmp(nsync_time a,nsync_time b)

{
  int iVar1;
  
  iVar1 = (uint)(b.tv_sec < a.tv_sec) - (uint)(a.tv_sec < b.tv_sec);
  if (iVar1 != 0) {
    return iVar1;
  }
  return (uint)(b.tv_nsec < a.tv_nsec) - (uint)(a.tv_nsec < b.tv_nsec);
}

Assistant:

int nsync_time_cmp (nsync_time a, nsync_time b) {
	int cmp = (NSYNC_TIME_SEC (a) > NSYNC_TIME_SEC (b)) -
		  (NSYNC_TIME_SEC (a) < NSYNC_TIME_SEC (b));
	if (cmp == 0) {
		cmp = (NSYNC_TIME_NSEC (a) > NSYNC_TIME_NSEC (b)) -
		      (NSYNC_TIME_NSEC (a) < NSYNC_TIME_NSEC (b));
	}
	return (cmp);
}